

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment.cpp
# Opt level: O1

void BrotliCompressFragmentFastImpl9
               (BrotliOnePassArena *s,uint8_t *input,size_t input_size,int is_last,int *table,
               size_t *storage_ix,uint8_t *storage)

{
  ulong *puVar1;
  uint32_t *__dest;
  uint32_t *puVar2;
  long *end;
  dword *pdVar3;
  int *piVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint8_t *s1_orig;
  ulong uVar9;
  uint32_t *puVar10;
  byte bVar11;
  ulong uVar12;
  size_t storage_ix_start;
  ulong *puVar13;
  ulong *puVar14;
  uint8_t *puVar15;
  uint8_t *extraout_RDX;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  long *plVar21;
  ulong *puVar22;
  ulong uVar23;
  uint8_t *puVar24;
  long *plVar25;
  long lVar26;
  long *plVar27;
  ulong uVar29;
  long *plVar30;
  Elf64_Ehdr *len;
  int *piVar31;
  Elf64_Ehdr *local_110;
  long *local_f8;
  ulong local_f0;
  long *local_e8;
  Elf64_Ehdr *local_d8;
  long *local_c0;
  ulong local_a0;
  dword *pdVar28;
  
  len = (Elf64_Ehdr *)0x18000;
  if (input_size < 0x18000) {
    len = (Elf64_Ehdr *)input_size;
  }
  storage_ix_start = *storage_ix;
  BrotliStoreMetaBlockHeader((size_t)len,0,storage_ix,storage);
  uVar17 = *storage_ix;
  uVar12 = uVar17 >> 3;
  *(ulong *)(storage + uVar12) = (ulong)storage[uVar12];
  *storage_ix = uVar17 + 0xd;
  local_a0 = BuildAndStoreLiteralPrefixCode
                       (s,input,(size_t)len,s->lit_depth,s->lit_bits,storage_ix,storage);
  uVar17 = s->cmd_code_numbits;
  if (7 < uVar17) {
    uVar12 = 0;
    do {
      uVar17 = *storage_ix;
      *(ulong *)(storage + (uVar17 >> 3)) =
           (ulong)s->cmd_code[uVar12 >> 3] << ((byte)uVar17 & 7) | (ulong)storage[uVar17 >> 3];
      *storage_ix = uVar17 + 8;
      uVar17 = s->cmd_code_numbits;
      uVar9 = uVar12 + 0xf;
      uVar12 = uVar12 + 8;
    } while (uVar9 < uVar17);
  }
  __dest = s->cmd_histo;
  uVar12 = *storage_ix;
  *(ulong *)(storage + (uVar12 >> 3)) =
       (ulong)s->cmd_code[uVar17 >> 3] << ((byte)uVar12 & 7) | (ulong)storage[uVar12 >> 3];
  *storage_ix = ((uint)uVar17 & 7) + uVar12;
  puVar2 = s->cmd_histo + 0x40;
  plVar25 = (long *)input;
  piVar31 = (int *)input;
  local_110 = (Elf64_Ehdr *)input_size;
  local_c0 = (long *)input;
LAB_01d50547:
  local_e8 = local_c0;
  local_f8 = plVar25;
  local_d8 = len;
LAB_01d50565:
  switchD_012dd528::default(__dest,kCmdHistoSeed,0x200);
  end = (long *)((long)local_e8 + (long)(len->e_ident_magic_str + -1));
  if ((Elf64_Ehdr *)0xf < len) {
    pdVar3 = (dword *)((long)&len[-1].e_shentsize + 1);
    pdVar28 = &local_110[-1].e_flags;
    if (pdVar3 < &local_110[-1].e_flags) {
      pdVar28 = pdVar3;
    }
    plVar27 = (long *)((long)pdVar28 + (long)local_e8);
    plVar25 = (long *)((long)local_e8 + 1);
    uVar17 = (ulong)(*(long *)((long)local_e8 + 1) * 0x1e35a7bd000000) >> 0x37;
    local_f0 = 0xffffffff;
LAB_01d505e1:
    puVar15 = (uint8_t *)0x20;
    plVar30 = plVar25;
    do {
      plVar21 = (long *)(((ulong)puVar15 >> 5) + (long)plVar30);
      iVar8 = (int)input;
      if (plVar27 < plVar21) {
        iVar20 = 0xb;
      }
      else {
        uVar12 = (ulong)(*plVar21 * 0x1e35a7bd000000) >> 0x37;
        if ((((int)*plVar30 == *(int *)((long)plVar30 + -(long)(int)(uint)local_f0)) &&
            (piVar31 = (int *)((long)plVar30 + -(long)(int)(uint)local_f0),
            *(char *)((long)plVar30 + 4) == (char)piVar31[1])) && (0 < (int)(uint)local_f0)) {
          table[uVar17] = (int)plVar30 - iVar8;
          iVar20 = 9;
          uVar17 = uVar12;
        }
        else {
          piVar31 = (int *)(input + table[uVar17]);
          table[uVar17] = (int)plVar30 - iVar8;
          iVar20 = 0;
          uVar17 = uVar12;
        }
      }
      if (iVar20 == 9) {
LAB_01d50677:
        if ((long)plVar30 - (long)piVar31 < 0x3fff1) goto LAB_01d506a1;
      }
      else {
        plVar25 = plVar30;
        if (iVar20 != 0) goto LAB_01d51347;
        if (((int)*plVar30 == *piVar31) && (*(char *)((long)plVar30 + 4) == (char)piVar31[1]))
        goto LAB_01d50677;
      }
      puVar15 = (uint8_t *)(ulong)((int)puVar15 + 1);
      plVar30 = plVar21;
    } while( true );
  }
  goto LAB_01d51507;
LAB_01d506a1:
  puVar1 = (ulong *)((long)piVar31 + 5);
  puVar22 = (ulong *)((long)plVar30 + 5);
  puVar13 = puVar1;
  for (puVar24 = (uint8_t *)((long)end + (-5 - (long)plVar30)); (uint8_t *)0x7 < puVar24;
      puVar24 = puVar24 + -8) {
    uVar12 = *puVar22;
    uVar9 = *puVar13;
    if (uVar12 == uVar9) {
      puVar13 = puVar13 + 1;
    }
    else {
      uVar16 = 0;
      if ((uVar9 ^ uVar12) != 0) {
        for (; ((uVar9 ^ uVar12) >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
        }
      }
      puVar15 = (uint8_t *)((long)puVar13 + ((uVar16 >> 3 & 0x1fffffff) - (long)puVar1));
    }
    if (uVar12 != uVar9) goto LAB_01d50729;
    puVar22 = puVar22 + 1;
  }
  puVar14 = puVar13;
  if (puVar24 != (uint8_t *)0x0) {
    puVar14 = (ulong *)((long)puVar13 + (long)puVar24);
    puVar15 = (uint8_t *)0x0;
    do {
      if (*(uint8_t *)((long)puVar13 + (long)puVar15) != *(uint8_t *)((long)puVar22 + (long)puVar15)
         ) {
        puVar14 = (ulong *)((long)puVar13 + (long)puVar15);
        break;
      }
      puVar15 = puVar15 + 1;
    } while (puVar24 != puVar15);
  }
  puVar15 = (uint8_t *)((long)puVar14 - (long)puVar1);
LAB_01d50729:
  uVar12 = (long)plVar30 - (long)local_f8;
  plVar25 = (long *)((long)plVar30 + (long)(puVar15 + 5));
  if (uVar12 < 0x1842) {
    if (uVar12 < 6) {
      bVar11 = *(byte *)((long)s + uVar12 + 0x328);
      uVar9 = *storage_ix;
      *(ulong *)(storage + (uVar9 >> 3)) =
           (ulong)*(ushort *)((long)s + uVar12 * 2 + 0x3d0) << ((byte)uVar9 & 7) |
           (ulong)storage[uVar9 >> 3];
      *storage_ix = bVar11 + uVar9;
      puVar10 = __dest + uVar12 + 0x28;
    }
    else if (uVar12 < 0x82) {
      uVar9 = uVar12 - 2;
      uVar18 = 0x1f;
      if ((uint)uVar9 != 0) {
        for (; (uint)uVar9 >> uVar18 == 0; uVar18 = uVar18 - 1) {
        }
      }
      uVar7 = (uVar18 ^ 0xffffffe0) + 0x1f;
      bVar11 = (byte)uVar7;
      uVar29 = uVar9 >> (bVar11 & 0x3f);
      lVar26 = ((uVar18 ^ 0xffffffe0) * 2 + 0x3e) + uVar29;
      uVar16 = *storage_ix;
      uVar23 = s->cmd_depth[lVar26 + 0x2a] + uVar16;
      *(ulong *)(storage + (uVar16 >> 3)) =
           (ulong)s->cmd_bits[lVar26 + 0x2a] << ((byte)uVar16 & 7) | (ulong)storage[uVar16 >> 3];
      *storage_ix = uVar23;
      *(ulong *)(storage + (uVar23 >> 3)) =
           uVar9 - (uVar29 << (bVar11 & 0x3f)) << ((byte)uVar23 & 7) | (ulong)storage[uVar23 >> 3];
      *storage_ix = uVar23 + uVar7;
      puVar10 = __dest + lVar26 + 0x2a;
    }
    else if (uVar12 < 0x842) {
      uVar7 = (int)uVar12 - 0x42;
      uVar18 = 0x1f;
      if (uVar7 != 0) {
        for (; uVar7 >> uVar18 == 0; uVar18 = uVar18 - 1) {
        }
      }
      lVar26 = -(ulong)(uVar18 ^ 0x1f) + 0x51;
      uVar9 = *storage_ix;
      uVar16 = *(byte *)((long)s + -(ulong)(uVar18 ^ 0x1f) + 0x351) + uVar9;
      *(ulong *)(storage + (uVar9 >> 3)) =
           (ulong)*(ushort *)((long)s + lVar26 * 2 + 0x380) << ((byte)uVar9 & 7) |
           (ulong)storage[uVar9 >> 3];
      *storage_ix = uVar16;
      *(ulong *)(storage + (uVar16 >> 3)) =
           (-1L << ((byte)uVar18 & 0x3f)) + uVar12 + -0x42 << ((byte)uVar16 & 7) |
           (ulong)storage[uVar16 >> 3];
      *storage_ix = uVar18 + uVar16;
      puVar10 = __dest + lVar26;
    }
    else {
      bVar11 = s->cmd_depth[0x3d];
      uVar16 = *storage_ix;
      uVar9 = uVar16 + bVar11;
      *(ulong *)(storage + (uVar16 >> 3)) =
           (ulong)s->cmd_bits[0x3d] << ((byte)uVar16 & 7) | (ulong)storage[uVar16 >> 3];
      *storage_ix = uVar9;
      *(ulong *)(storage + (uVar9 >> 3)) =
           uVar12 - 0x842 << ((byte)uVar9 & 7) | (ulong)storage[uVar9 >> 3];
      *storage_ix = bVar11 + uVar16 + 0xc;
      puVar10 = s->cmd_histo + 0x3d;
    }
  }
  else {
    uVar9 = ((long)local_f8 - (long)local_c0) * 0x32;
    if ((uVar9 < uVar12 || uVar9 - uVar12 == 0) && (0x3d4 < local_a0)) {
      EmitUncompressedMetaBlock
                ((uint8_t *)local_c0,(uint8_t *)plVar30,storage_ix_start,storage_ix,storage);
      local_110 = (Elf64_Ehdr *)
                  ((long)local_e8 + (long)(local_110->e_ident_magic_str + (-1 - (long)plVar30)));
      iVar20 = 0xc;
      bVar5 = false;
      puVar24 = extraout_RDX;
      local_e8 = plVar30;
      goto LAB_01d50eca;
    }
    if (uVar12 < 0x5842) {
      bVar11 = s->cmd_depth[0x3e];
      uVar16 = *storage_ix;
      uVar9 = uVar16 + bVar11;
      *(ulong *)(storage + (uVar16 >> 3)) =
           (ulong)s->cmd_bits[0x3e] << ((byte)uVar16 & 7) | (ulong)storage[uVar16 >> 3];
      *storage_ix = uVar9;
      *(ulong *)(storage + (uVar9 >> 3)) =
           uVar12 - 0x1842 << ((byte)uVar9 & 7) | (ulong)storage[uVar9 >> 3];
      *storage_ix = bVar11 + uVar16 + 0xe;
      puVar10 = s->cmd_histo + 0x3e;
    }
    else {
      bVar11 = s->cmd_depth[0x3f];
      uVar16 = *storage_ix;
      uVar9 = uVar16 + bVar11;
      *(ulong *)(storage + (uVar16 >> 3)) =
           (ulong)s->cmd_bits[0x3f] << ((byte)uVar16 & 7) | (ulong)storage[uVar16 >> 3];
      *storage_ix = uVar9;
      *(ulong *)(storage + (uVar9 >> 3)) =
           uVar12 - 0x5842 << ((byte)uVar9 & 7) | (ulong)storage[uVar9 >> 3];
      *storage_ix = bVar11 + uVar16 + 0x18;
      puVar10 = s->cmd_histo + 0x3f;
    }
  }
  *puVar10 = *puVar10 + 1;
  if (plVar30 != local_f8) {
    uVar9 = *storage_ix;
    lVar26 = 0;
    do {
      bVar11 = s->lit_depth[*(byte *)((long)local_f8 + lVar26)];
      *(ulong *)(storage + (uVar9 >> 3)) =
           (ulong)s->lit_bits[*(byte *)((long)local_f8 + lVar26)] << ((byte)uVar9 & 7) |
           (ulong)storage[uVar9 >> 3];
      uVar9 = uVar9 + bVar11;
      *storage_ix = uVar9;
      lVar26 = lVar26 + 1;
    } while (uVar12 + (uVar12 == 0) != lVar26);
  }
  uVar18 = (uint)((long)plVar30 - (long)piVar31);
  if ((uint)local_f0 == uVar18) {
    bVar11 = s->cmd_depth[0x40];
    uVar12 = *storage_ix;
    *(ulong *)(storage + (uVar12 >> 3)) =
         (ulong)s->cmd_bits[0x40] << ((byte)uVar12 & 7) | (ulong)storage[uVar12 >> 3];
    *storage_ix = bVar11 + uVar12;
    puVar10 = puVar2;
    uVar18 = (uint)local_f0;
  }
  else {
    uVar12 = (long)(int)uVar18 + 3;
    uVar7 = 0x1f;
    if ((uint)uVar12 != 0) {
      for (; (uint)uVar12 >> uVar7 == 0; uVar7 = uVar7 - 1) {
      }
    }
    uVar6 = 0x1e - (uVar7 ^ 0x1f);
    uVar23 = (ulong)((uVar12 >> ((ulong)uVar6 & 0x3f) & 1) != 0);
    uVar16 = ((uVar7 ^ 0x1f) * 2 ^ 0x3e) - 4 | uVar23;
    uVar9 = *storage_ix;
    uVar29 = s->cmd_depth[uVar16 + 0x50] + uVar9;
    *(ulong *)(storage + (uVar9 >> 3)) =
         (ulong)*(ushort *)((long)s->cmd_histo + uVar16 * 2 + -0x60) << ((byte)uVar9 & 7) |
         (ulong)storage[uVar9 >> 3];
    *storage_ix = uVar29;
    *(ulong *)(storage + (uVar29 >> 3)) =
         uVar12 - (uVar23 + 2 << ((byte)uVar6 & 0x3f)) << ((byte)uVar29 & 7) |
         (ulong)storage[uVar29 >> 3];
    *storage_ix = uVar29 + uVar6;
    puVar10 = __dest + uVar16 + 0x50;
  }
  puVar24 = puVar15 + 5;
  *puVar10 = *puVar10 + 1;
  local_f0 = (ulong)uVar18;
  if (puVar24 < (uint8_t *)0xc) {
    bVar11 = s->cmd_depth[(long)(puVar15 + 1)];
    uVar12 = *storage_ix;
    *(ulong *)(storage + (uVar12 >> 3)) =
         (ulong)s->cmd_bits[(long)(puVar15 + 1)] << ((byte)uVar12 & 7) | (ulong)storage[uVar12 >> 3]
    ;
    *storage_ix = bVar11 + uVar12;
    puVar10 = __dest + (long)(puVar15 + 1);
    puVar24 = puVar15;
  }
  else if (puVar24 < (uint8_t *)0x48) {
    puVar24 = puVar15 + -3;
    uVar18 = 0x1f;
    if ((uint)puVar24 != 0) {
      for (; (uint)puVar24 >> uVar18 == 0; uVar18 = uVar18 - 1) {
      }
    }
    uVar7 = (uVar18 ^ 0xffffffe0) + 0x1f;
    bVar11 = (byte)uVar7;
    uVar16 = (ulong)puVar24 >> (bVar11 & 0x3f);
    lVar26 = ((uVar18 ^ 0xffffffe0) * 2 + 0x3e) + uVar16;
    uVar12 = *storage_ix;
    uVar9 = s->cmd_depth[lVar26 + 4] + uVar12;
    *(ulong *)(storage + (uVar12 >> 3)) =
         (ulong)s->cmd_bits[lVar26 + 4] << ((byte)uVar12 & 7) | (ulong)storage[uVar12 >> 3];
    *storage_ix = uVar9;
    puVar24 = (uint8_t *)
              ((long)puVar24 - (uVar16 << (bVar11 & 0x3f)) << ((byte)uVar9 & 7) |
              (ulong)storage[uVar9 >> 3]);
    *(uint8_t **)(storage + (uVar9 >> 3)) = puVar24;
    *storage_ix = uVar9 + uVar7;
    puVar10 = __dest + lVar26 + 4;
  }
  else {
    puVar10 = puVar2;
    if (puVar24 < (uint8_t *)0x88) {
      uVar23 = (ulong)(puVar15 + -3) >> 5;
      uVar9 = *storage_ix;
      uVar12 = uVar9 + s->cmd_depth[uVar23 + 0x1e];
      uVar16 = s->cmd_depth[uVar23 + 0x1e] + uVar9 + 5;
      *(ulong *)(storage + (uVar9 >> 3)) =
           (ulong)s->cmd_bits[uVar23 + 0x1e] << ((byte)uVar9 & 7) | (ulong)storage[uVar9 >> 3];
      *storage_ix = uVar12;
      *(ulong *)(storage + (uVar12 >> 3)) =
           (ulong)((uint)(puVar15 + -3) & 0x1f) << ((byte)uVar12 & 7) | (ulong)storage[uVar12 >> 3];
      *storage_ix = uVar16;
      puVar24 = (uint8_t *)(ulong)s->cmd_depth[0x40];
      *(ulong *)(storage + (uVar16 >> 3)) =
           (ulong)s->cmd_bits[0x40] << ((byte)uVar16 & 7) | (ulong)storage[uVar16 >> 3];
      *storage_ix = (size_t)(puVar24 + uVar12 + 5);
      s->cmd_histo[uVar23 + 0x1e] = s->cmd_histo[uVar23 + 0x1e] + 1;
    }
    else if (puVar24 < (uint8_t *)0x848) {
      uVar7 = (int)puVar15 - 0x43;
      uVar18 = 0x1f;
      if (uVar7 != 0) {
        for (; uVar7 >> uVar18 == 0; uVar18 = uVar18 - 1) {
        }
      }
      lVar26 = -(ulong)(uVar18 ^ 0x1f) + 0x3b;
      uVar12 = *storage_ix;
      uVar9 = *(byte *)((long)s + -(ulong)(uVar18 ^ 0x1f) + 0x33b) + uVar12;
      *(ulong *)(storage + (uVar12 >> 3)) =
           (ulong)*(ushort *)((long)s + lVar26 * 2 + 0x380) << ((byte)uVar12 & 7) |
           (ulong)storage[uVar12 >> 3];
      *storage_ix = uVar9;
      uVar12 = uVar18 + uVar9;
      *(ulong *)(storage + (uVar9 >> 3)) =
           (long)(puVar15 + (-1L << ((byte)uVar18 & 0x3f)) + -0x43) << ((byte)uVar9 & 7) |
           (ulong)storage[uVar9 >> 3];
      *storage_ix = uVar12;
      puVar24 = (uint8_t *)(s->cmd_depth[0x40] + uVar12);
      *(ulong *)(storage + (uVar12 >> 3)) =
           (ulong)s->cmd_bits[0x40] << ((byte)uVar12 & 7) | (ulong)storage[uVar12 >> 3];
      *storage_ix = (size_t)puVar24;
      piVar4 = (int *)((long)s + lVar26 * 4 + 0x480);
      *piVar4 = *piVar4 + 1;
    }
    else {
      uVar9 = *storage_ix;
      uVar12 = uVar9 + s->cmd_depth[0x27];
      uVar16 = s->cmd_depth[0x27] + uVar9 + 0x18;
      *(ulong *)(storage + (uVar9 >> 3)) =
           (ulong)s->cmd_bits[0x27] << ((byte)uVar9 & 7) | (ulong)storage[uVar9 >> 3];
      *storage_ix = uVar12;
      bVar11 = (byte)uVar12 & 7;
      *(ulong *)(storage + (uVar12 >> 3)) =
           (long)(puVar15 + -0x843) << bVar11 | (ulong)storage[uVar12 >> 3];
      *storage_ix = uVar16;
      puVar24 = (uint8_t *)(ulong)s->cmd_depth[0x40];
      uVar16 = uVar16 >> 3;
      *(ulong *)(storage + uVar16) = (ulong)s->cmd_bits[0x40] << bVar11 | (ulong)storage[uVar16];
      *storage_ix = (size_t)(puVar24 + uVar12 + 0x18);
      s->cmd_histo[0x27] = s->cmd_histo[0x27] + 1;
    }
  }
  *puVar10 = *puVar10 + 1;
  iVar20 = 0;
  if (plVar25 < plVar27) {
    uVar12 = *(ulong *)((long)plVar30 + (long)(puVar15 + 2));
    puVar24 = (uint8_t *)((uVar12 >> 0x18) * 0x1e35a7bd000000 >> 0x37);
    iVar19 = (int)plVar25 - iVar8;
    table[uVar12 * 0x1e35a7bd000000 >> 0x37] = iVar19 + -3;
    table[(uVar12 >> 8) * 0x1e35a7bd000000 >> 0x37] = iVar19 + -2;
    table[(uVar12 >> 0x10) * 0x1e35a7bd000000 >> 0x37] = iVar19 + -1;
    piVar31 = (int *)(input + table[(long)puVar24]);
    table[(long)puVar24] = iVar19;
    bVar5 = true;
    plVar30 = plVar25;
  }
  else {
    iVar20 = 0xb;
    bVar5 = false;
    plVar30 = plVar25;
  }
LAB_01d50eca:
  plVar21 = plVar25;
  local_f8 = plVar30;
  if (bVar5) {
    do {
      plVar25 = plVar21;
      if (((int)*plVar21 != *piVar31) || (*(uint8_t *)((long)plVar21 + 4) != (uint8_t)piVar31[1]))
      goto LAB_01d51331;
      puVar1 = (ulong *)((long)piVar31 + 5);
      puVar22 = (ulong *)((long)plVar21 + 5);
      puVar13 = puVar1;
      for (puVar15 = (uint8_t *)((long)end + (-5 - (long)plVar21)); (uint8_t *)0x7 < puVar15;
          puVar15 = puVar15 + -8) {
        uVar12 = *puVar22;
        uVar9 = *puVar13;
        if (uVar12 == uVar9) {
          puVar13 = puVar13 + 1;
        }
        else {
          uVar16 = 0;
          if ((uVar9 ^ uVar12) != 0) {
            for (; ((uVar9 ^ uVar12) >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
            }
          }
          puVar24 = (uint8_t *)((long)puVar13 + ((uVar16 >> 3 & 0x1fffffff) - (long)puVar1));
        }
        if (uVar12 != uVar9) goto LAB_01d50f78;
        puVar22 = puVar22 + 1;
      }
      puVar14 = puVar13;
      if (puVar15 != (uint8_t *)0x0) {
        puVar14 = (ulong *)((long)puVar13 + (long)puVar15);
        puVar24 = (uint8_t *)0x0;
        do {
          if (*(uint8_t *)((long)puVar13 + (long)puVar24) !=
              *(uint8_t *)((long)puVar22 + (long)puVar24)) {
            puVar14 = (ulong *)((long)puVar13 + (long)puVar24);
            break;
          }
          puVar24 = puVar24 + 1;
        } while (puVar15 != puVar24);
      }
      puVar24 = (uint8_t *)((long)puVar14 - (long)puVar1);
LAB_01d50f78:
      uVar12 = (long)plVar21 - (long)piVar31;
      iVar20 = 0xe;
      if ((long)uVar12 < 0x3fff1) {
        puVar15 = puVar24 + 5;
        if (puVar15 < (uint8_t *)0xa) {
          bVar11 = s->cmd_depth[(long)(puVar24 + 0x13)];
          uVar9 = *storage_ix;
          *(ulong *)(storage + (uVar9 >> 3)) =
               (ulong)s->cmd_bits[(long)(puVar24 + 0x13)] << ((byte)uVar9 & 7) |
               (ulong)storage[uVar9 >> 3];
          *storage_ix = bVar11 + uVar9;
          puVar10 = __dest + (long)(puVar24 + 0x13);
        }
        else if (puVar15 < (uint8_t *)0x86) {
          puVar15 = puVar24 + -1;
          uVar18 = 0x1f;
          if ((uint)puVar15 != 0) {
            for (; (uint)puVar15 >> uVar18 == 0; uVar18 = uVar18 - 1) {
            }
          }
          uVar7 = (uVar18 ^ 0xffffffe0) + 0x1f;
          bVar11 = (byte)uVar7;
          uVar23 = (ulong)puVar15 >> (bVar11 & 0x3f);
          lVar26 = ((uVar18 ^ 0xffffffe0) * 2 + 0x3e) + uVar23;
          uVar9 = *storage_ix;
          uVar16 = s->cmd_depth[lVar26 + 0x14] + uVar9;
          *(ulong *)(storage + (uVar9 >> 3)) =
               (ulong)s->cmd_bits[lVar26 + 0x14] << ((byte)uVar9 & 7) | (ulong)storage[uVar9 >> 3];
          *storage_ix = uVar16;
          *(ulong *)(storage + (uVar16 >> 3)) =
               (long)puVar15 - (uVar23 << (bVar11 & 0x3f)) << ((byte)uVar16 & 7) |
               (ulong)storage[uVar16 >> 3];
          *storage_ix = uVar16 + uVar7;
          puVar10 = __dest + lVar26 + 0x14;
        }
        else if (puVar15 < (uint8_t *)0x846) {
          uVar7 = (int)puVar24 - 0x41;
          uVar18 = 0x1f;
          if (uVar7 != 0) {
            for (; uVar7 >> uVar18 == 0; uVar18 = uVar18 - 1) {
            }
          }
          lVar26 = -(ulong)(uVar18 ^ 0x1f) + 0x3b;
          uVar9 = *storage_ix;
          uVar16 = *(byte *)((long)s + -(ulong)(uVar18 ^ 0x1f) + 0x33b) + uVar9;
          *(ulong *)(storage + (uVar9 >> 3)) =
               (ulong)*(ushort *)((long)s + lVar26 * 2 + 0x380) << ((byte)uVar9 & 7) |
               (ulong)storage[uVar9 >> 3];
          *storage_ix = uVar16;
          *(ulong *)(storage + (uVar16 >> 3)) =
               (long)(puVar24 + (-1L << ((byte)uVar18 & 0x3f)) + -0x41) << ((byte)uVar16 & 7) |
               (ulong)storage[uVar16 >> 3];
          *storage_ix = uVar18 + uVar16;
          puVar10 = __dest + lVar26;
        }
        else {
          bVar11 = s->cmd_depth[0x27];
          uVar16 = *storage_ix;
          uVar9 = uVar16 + bVar11;
          *(ulong *)(storage + (uVar16 >> 3)) =
               (ulong)s->cmd_bits[0x27] << ((byte)uVar16 & 7) | (ulong)storage[uVar16 >> 3];
          *storage_ix = uVar9;
          *(ulong *)(storage + (uVar9 >> 3)) =
               (long)(puVar24 + -0x841) << ((byte)uVar9 & 7) | (ulong)storage[uVar9 >> 3];
          *storage_ix = bVar11 + uVar16 + 0x18;
          puVar10 = s->cmd_histo + 0x27;
        }
        *puVar10 = *puVar10 + 1;
        uVar9 = (long)(int)uVar12 + 3;
        uVar18 = 0x1f;
        if ((uint)uVar9 != 0) {
          for (; (uint)uVar9 >> uVar18 == 0; uVar18 = uVar18 - 1) {
          }
        }
        uVar7 = 0x1e - (uVar18 ^ 0x1f);
        uVar29 = (ulong)((uVar9 >> ((ulong)uVar7 & 0x3f) & 1) != 0);
        uVar23 = ((uVar18 ^ 0x1f) * 2 ^ 0x3e) - 4 | uVar29;
        uVar16 = *storage_ix;
        bVar11 = s->cmd_depth[uVar23 + 0x50];
        *(ulong *)(storage + (uVar16 >> 3)) =
             (ulong)*(ushort *)((long)s->cmd_histo + uVar23 * 2 + -0x60) << ((byte)uVar16 & 7) |
             (ulong)storage[uVar16 >> 3];
        uVar16 = bVar11 + uVar16;
        *storage_ix = uVar16;
        *(ulong *)(storage + (uVar16 >> 3)) =
             uVar9 - (uVar29 + 2 << ((byte)uVar7 & 0x3f)) << ((byte)uVar16 & 7) |
             (ulong)storage[uVar16 >> 3];
        plVar25 = (long *)((long)plVar21 + (long)(puVar24 + 5));
        *storage_ix = uVar16 + uVar7;
        s->cmd_histo[uVar23 + 0x50] = s->cmd_histo[uVar23 + 0x50] + 1;
        plVar30 = plVar25;
        local_f0 = uVar12;
        if (plVar25 < plVar27) {
          uVar12 = *(ulong *)((long)plVar21 + (long)(puVar24 + 2));
          uVar9 = (uVar12 >> 0x18) * 0x1e35a7bd000000 >> 0x37;
          iVar20 = (int)plVar25 - iVar8;
          table[uVar12 * 0x1e35a7bd000000 >> 0x37] = iVar20 + -3;
          table[(uVar12 >> 8) * 0x1e35a7bd000000 >> 0x37] = iVar20 + -2;
          puVar24 = (uint8_t *)(ulong)(iVar20 - 1U);
          table[(uVar12 >> 0x10) * 0x1e35a7bd000000 >> 0x37] = iVar20 - 1U;
          piVar31 = (int *)(input + table[uVar9]);
          table[uVar9] = iVar20;
          iVar20 = 0;
        }
        else {
          iVar20 = 0xb;
        }
      }
      plVar21 = plVar25;
    } while (iVar20 == 0);
    local_f8 = plVar30;
    if (iVar20 == 0xe) {
LAB_01d51331:
      plVar21 = (long *)((long)plVar25 + 1);
      plVar25 = (long *)((long)plVar25 + 1);
      uVar17 = (ulong)(*plVar21 * 0x1e35a7bd000000) >> 0x37;
      iVar20 = 0;
      local_f8 = plVar30;
    }
  }
LAB_01d51347:
  if (iVar20 != 0) goto LAB_01d514e7;
  goto LAB_01d505e1;
LAB_01d514e7:
  plVar25 = local_f8;
  if (iVar20 == 0xc) goto LAB_01d51595;
LAB_01d51507:
  local_e8 = (long *)((long)local_e8 + (long)len);
  local_110 = (Elf64_Ehdr *)((long)local_110 - (long)len);
  len = (Elf64_Ehdr *)0x10000;
  if (local_110 < (Elf64_Ehdr *)0x10000) {
    len = local_110;
  }
  if (((local_110 == (Elf64_Ehdr *)0x0) ||
      (local_d8 = (Elf64_Ehdr *)(len->e_ident_magic_str + (long)(local_d8->e_ident_magic_str + -2)),
      &duckdb::StructBoundCastData::~StructBoundCastData < local_d8)) ||
     (iVar8 = ShouldMergeBlock(s,(uint8_t *)local_e8,(size_t)len,s->lit_depth), iVar8 == 0))
  goto LAB_01d5165d;
  UpdateBits((ulong)((int)local_d8 - 1),(int)storage_ix_start + 3,(size_t)storage,
             (uint8_t *)local_d8);
  goto LAB_01d50565;
LAB_01d5165d:
  plVar25 = end;
  if (local_f8 < end) {
    uVar17 = (long)end - (long)local_f8;
    if (uVar17 < 0x1842) {
      if (uVar17 < 6) {
        bVar11 = *(byte *)((long)s + uVar17 + 0x328);
        uVar12 = *storage_ix;
        *(ulong *)(storage + (uVar12 >> 3)) =
             (ulong)*(ushort *)((long)s + uVar17 * 2 + 0x3d0) << ((byte)uVar12 & 7) |
             (ulong)storage[uVar12 >> 3];
        *storage_ix = bVar11 + uVar12;
        puVar10 = __dest + uVar17 + 0x28;
      }
      else if (uVar17 < 0x82) {
        uVar12 = uVar17 - 2;
        uVar18 = 0x1f;
        if ((uint)uVar12 != 0) {
          for (; (uint)uVar12 >> uVar18 == 0; uVar18 = uVar18 - 1) {
          }
        }
        uVar7 = (uVar18 ^ 0xffffffe0) + 0x1f;
        bVar11 = (byte)uVar7;
        uVar23 = uVar12 >> (bVar11 & 0x3f);
        lVar26 = ((uVar18 ^ 0xffffffe0) * 2 + 0x3e) + uVar23;
        uVar9 = *storage_ix;
        uVar16 = s->cmd_depth[lVar26 + 0x2a] + uVar9;
        *(ulong *)(storage + (uVar9 >> 3)) =
             (ulong)s->cmd_bits[lVar26 + 0x2a] << ((byte)uVar9 & 7) | (ulong)storage[uVar9 >> 3];
        *storage_ix = uVar16;
        *(ulong *)(storage + (uVar16 >> 3)) =
             uVar12 - (uVar23 << (bVar11 & 0x3f)) << ((byte)uVar16 & 7) |
             (ulong)storage[uVar16 >> 3];
        *storage_ix = uVar16 + uVar7;
        puVar10 = __dest + lVar26 + 0x2a;
      }
      else if (uVar17 < 0x842) {
        uVar7 = (int)uVar17 - 0x42;
        uVar18 = 0x1f;
        if (uVar7 != 0) {
          for (; uVar7 >> uVar18 == 0; uVar18 = uVar18 - 1) {
          }
        }
        lVar26 = -(ulong)(uVar18 ^ 0x1f) + 0x51;
        uVar12 = *storage_ix;
        uVar9 = *(byte *)((long)s + -(ulong)(uVar18 ^ 0x1f) + 0x351) + uVar12;
        *(ulong *)(storage + (uVar12 >> 3)) =
             (ulong)*(ushort *)((long)s + lVar26 * 2 + 0x380) << ((byte)uVar12 & 7) |
             (ulong)storage[uVar12 >> 3];
        *storage_ix = uVar9;
        *(ulong *)(storage + (uVar9 >> 3)) =
             (-1L << ((byte)uVar18 & 0x3f)) + uVar17 + -0x42 << ((byte)uVar9 & 7) |
             (ulong)storage[uVar9 >> 3];
        *storage_ix = uVar18 + uVar9;
        puVar10 = __dest + lVar26;
      }
      else {
        bVar11 = s->cmd_depth[0x3d];
        uVar9 = *storage_ix;
        uVar12 = uVar9 + bVar11;
        *(ulong *)(storage + (uVar9 >> 3)) =
             (ulong)s->cmd_bits[0x3d] << ((byte)uVar9 & 7) | (ulong)storage[uVar9 >> 3];
        *storage_ix = uVar12;
        *(ulong *)(storage + (uVar12 >> 3)) =
             uVar17 - 0x842 << ((byte)uVar12 & 7) | (ulong)storage[uVar12 >> 3];
        *storage_ix = bVar11 + uVar9 + 0xc;
        puVar10 = s->cmd_histo + 0x3d;
      }
      *puVar10 = *puVar10 + 1;
      if (end != local_f8) {
        uVar12 = *storage_ix;
        lVar26 = 0;
        do {
          bVar11 = s->lit_depth[*(byte *)((long)local_f8 + lVar26)];
          *(ulong *)(storage + (uVar12 >> 3)) =
               (ulong)s->lit_bits[*(byte *)((long)local_f8 + lVar26)] << ((byte)uVar12 & 7) |
               (ulong)storage[uVar12 >> 3];
          uVar12 = uVar12 + bVar11;
          *storage_ix = uVar12;
          lVar26 = lVar26 + 1;
        } while (uVar17 + (uVar17 == 0) != lVar26);
      }
    }
    else {
      uVar12 = ((long)local_f8 - (long)local_c0) * 0x32;
      if ((uVar12 < uVar17 || uVar12 - uVar17 == 0) && (0x3d4 < local_a0)) {
        EmitUncompressedMetaBlock
                  ((uint8_t *)local_c0,(uint8_t *)end,storage_ix_start,storage_ix,storage);
      }
      else {
        if (uVar17 < 0x5842) {
          uVar9 = *storage_ix;
          uVar12 = uVar9 + s->cmd_depth[0x3e];
          uVar16 = s->cmd_depth[0x3e] + uVar9 + 0xe;
          *(ulong *)(storage + (uVar9 >> 3)) =
               (ulong)s->cmd_bits[0x3e] << ((byte)uVar9 & 7) | (ulong)storage[uVar9 >> 3];
          *storage_ix = uVar12;
          *(ulong *)(storage + (uVar12 >> 3)) =
               uVar17 - 0x1842 << ((byte)uVar12 & 7) | (ulong)storage[uVar12 >> 3];
          puVar10 = s->cmd_histo + 0x3e;
        }
        else {
          uVar9 = *storage_ix;
          uVar12 = uVar9 + s->cmd_depth[0x3f];
          uVar16 = s->cmd_depth[0x3f] + uVar9 + 0x18;
          *(ulong *)(storage + (uVar9 >> 3)) =
               (ulong)s->cmd_bits[0x3f] << ((byte)uVar9 & 7) | (ulong)storage[uVar9 >> 3];
          *storage_ix = uVar12;
          *(ulong *)(storage + (uVar12 >> 3)) =
               uVar17 - 0x5842 << ((byte)uVar12 & 7) | (ulong)storage[uVar12 >> 3];
          puVar10 = s->cmd_histo + 0x3f;
        }
        *storage_ix = uVar16;
        *puVar10 = *puVar10 + 1;
        lVar26 = 0;
        do {
          bVar11 = s->lit_depth[*(byte *)((long)local_f8 + lVar26)];
          *(ulong *)(storage + (uVar16 >> 3)) =
               (ulong)s->lit_bits[*(byte *)((long)local_f8 + lVar26)] << ((byte)uVar16 & 7) |
               (ulong)storage[uVar16 >> 3];
          uVar16 = uVar16 + bVar11;
          *storage_ix = uVar16;
          lVar26 = lVar26 + 1;
        } while (uVar17 + (uVar17 == 0) != lVar26);
      }
    }
  }
LAB_01d51595:
  if (local_110 == (Elf64_Ehdr *)0x0) {
    if (is_last != 0) {
      return;
    }
    s->cmd_code[0] = '\0';
    s->cmd_code_numbits = 0;
    BuildAndStoreCommandPrefixCode(s,&s->cmd_code_numbits,s->cmd_code);
    return;
  }
  len = (Elf64_Ehdr *)0x18000;
  if (local_110 < (Elf64_Ehdr *)0x18000) {
    len = local_110;
  }
  storage_ix_start = *storage_ix;
  BrotliStoreMetaBlockHeader((size_t)len,0,storage_ix,storage);
  uVar17 = *storage_ix;
  uVar12 = uVar17 >> 3;
  *(ulong *)(storage + uVar12) = (ulong)storage[uVar12];
  *storage_ix = uVar17 + 0xd;
  local_a0 = BuildAndStoreLiteralPrefixCode
                       (s,(uint8_t *)local_e8,(size_t)len,s->lit_depth,s->lit_bits,storage_ix,
                        storage);
  BuildAndStoreCommandPrefixCode(s,storage_ix,storage);
  local_c0 = local_e8;
  goto LAB_01d50547;
}

Assistant:

void duckdb_brotli::BrotliCompressFragmentFast(
    BrotliOnePassArena* s, const uint8_t* input, size_t input_size,
    BROTLI_BOOL is_last, int* table, size_t table_size,
    size_t* storage_ix, uint8_t* storage) {
  const size_t initial_storage_ix = *storage_ix;
  const size_t table_bits = Log2FloorNonZero(table_size);

  if (input_size == 0) {
    BROTLI_DCHECK(is_last);
    BrotliWriteBits(1, 1, storage_ix, storage);  /* islast */
    BrotliWriteBits(1, 1, storage_ix, storage);  /* isempty */
    *storage_ix = (*storage_ix + 7u) & ~7u;
    return;
  }

  switch (table_bits) {
#define CASE_(B)                                                     \
    case B:                                                          \
      BrotliCompressFragmentFastImpl ## B(                           \
          s, input, input_size, is_last, table, storage_ix, storage);\
      break;
    FOR_TABLE_BITS_(CASE_)
#undef CASE_
    default: BROTLI_DCHECK(0); break;
  }

  /* If output is larger than single uncompressed block, rewrite it. */
  if (*storage_ix - initial_storage_ix > 31 + (input_size << 3)) {
    EmitUncompressedMetaBlock(input, input + input_size, initial_storage_ix,
                              storage_ix, storage);
  }

  if (is_last) {
    BrotliWriteBits(1, 1, storage_ix, storage);  /* islast */
    BrotliWriteBits(1, 1, storage_ix, storage);  /* isempty */
    *storage_ix = (*storage_ix + 7u) & ~7u;
  }
}